

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall capnp::_::BuilderArena::LocalCapTable::dropCap(LocalCapTable *this,uint index)

{
  bool bVar1;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *this_00;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_78 [2];
  Fault local_58;
  Fault f;
  uint *local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  uint index_local;
  LocalCapTable *this_local;
  
  _kjCondition._36_4_ = index;
  local_48 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)&_kjCondition.field_0x24);
  f.exception = (Exception *)
                kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::size
                          (&this->capTable);
  kj::_::DebugExpression<unsigned_int&>::operator<
            ((DebugComparison<unsigned_int_&,_unsigned_long> *)local_40,
             (DebugExpression<unsigned_int&> *)&local_48,(unsigned_long *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (bVar1) {
    kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Maybe(local_78);
    this_00 = kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::operator[]
                        (&this->capTable,(ulong)(uint)_kjCondition._36_4_);
    kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::operator=(this_00,local_78);
    kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe(local_78);
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&,char_const(&)[42]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
               ,0x180,FAILED,"index < capTable.size()",
               "_kjCondition,\"Invalid capability descriptor in message.\"",
               (DebugComparison<unsigned_int_&,_unsigned_long> *)local_40,
               (char (*) [42])"Invalid capability descriptor in message.");
    kj::_::Debug::Fault::~Fault(&local_58);
  }
  return;
}

Assistant:

void BuilderArena::LocalCapTable::dropCap(uint index) {
#if CAPNP_LITE
  KJ_UNIMPLEMENTED("no cap tables in lite mode");
#else
  KJ_ASSERT(index < capTable.size(), "Invalid capability descriptor in message.") {
    return;
  }
  capTable[index] = kj::none;
#endif
}